

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  ulong uVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  uint64_t recursive;
  uint64_t m;
  uint64_t n;
  Graph g;
  uint64_t local_120;
  uint64_t local_118;
  _Bind<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_110;
  _Bind<std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_f8;
  _Bind<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_e0;
  Graph local_c8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter n and m: ",0xf);
  piVar1 = std::istream::_M_extract<unsigned_long>(&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wanna sum recursion? ",0x15);
  std::istream::_M_extract<unsigned_long>(&std::cin);
  Graph::Graph(&local_c8,local_118,local_120);
  uVar2 = local_120 * local_118;
  if (uVar2 < 0x3e9) {
    operator<<((ostream *)&std::cout,&local_c8);
  }
  local_e0._M_f = (offset_in_Graph_to_subr)Graph::random_bridges_search;
  local_e0._8_8_ = 0;
  name._M_str = "Random";
  name._M_len = 6;
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&local_c8,name,&local_e0,uVar2 < 0x3e9);
  local_f8._M_f = (offset_in_Graph_to_subr)Graph::random_two_bridges_search;
  local_f8._8_8_ = 0;
  name_00._M_str = "Random two-bridges";
  name_00._M_len = 0x12;
  estimate<std::_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&local_c8,name_00,&local_f8,uVar2 < 0x3e9);
  local_110._M_f = (offset_in_Graph_to_subr)Graph::determined_bridges_search;
  local_110._8_8_ = 0;
  name_01._M_str = "Determenistic";
  name_01._M_len = 0xd;
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&local_c8,name_01,&local_110,uVar2 < 0x3e9);
  Graph::~Graph(&local_c8);
  return 0;
}

Assistant:

int main() {
    std::uint64_t n, m, recursive;

    std::cout << "Enter n and m: ";
    std::cin >> n >> m;
    std::cout << "Wanna sum recursion? ";
    std::cin >> recursive;

    Graph g(n, m);

    bool show = (n * m <= 1000);
    if (show)
        std::cout << g;

    estimate(g, "Random",
             std::bind(&Graph::random_bridges_search, _1, recursive), show);
    estimate(g, "Random two-bridges",
             std::bind(&Graph::random_two_bridges_search, _1, recursive), show);
    estimate(g, "Determenistic",
             std::bind(&Graph::determined_bridges_search, _1, recursive), show);
}